

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O1

int * inform_black_box(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,int *box,
                      inform_error *err)

{
  void *__dest;
  long lVar1;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  size_t i;
  size_t sVar5;
  int *__ptr;
  void *__dest_00;
  int *piVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  int iVar14;
  int iVar15;
  int *local_70;
  
  _Var4 = check_arguments(series,l,n,m,b,r,s,err);
  if (_Var4) {
    return (int *)0x0;
  }
  if (s == (size_t *)0x0 && r != (size_t *)0x0) {
    uVar9 = 1;
    if (l != 0) {
      uVar12 = 0;
      sVar5 = 0;
      do {
        if (uVar9 < r[sVar5]) {
          uVar9 = r[sVar5];
        }
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
      goto LAB_001090d6;
    }
  }
  else {
    if (s == (size_t *)0x0 || r != (size_t *)0x0) {
      uVar9 = 1;
      uVar12 = 0;
      if (((r != (size_t *)0x0) && (uVar12 = 0, l != 0)) && (s != (size_t *)0x0)) {
        uVar12 = 0;
        sVar5 = 0;
        do {
          if (uVar9 < r[sVar5]) {
            uVar9 = r[sVar5];
          }
          if (uVar12 < s[sVar5]) {
            uVar12 = s[sVar5];
          }
          sVar5 = sVar5 + 1;
        } while (l != sVar5);
      }
      goto LAB_001090d6;
    }
    uVar9 = 1;
    if (l != 0) {
      uVar12 = 0;
      sVar5 = 0;
      do {
        if (uVar12 < s[sVar5]) {
          uVar12 = s[sVar5];
        }
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
      goto LAB_001090d6;
    }
  }
  uVar9 = 1;
  uVar12 = 0;
LAB_001090d6:
  __ptr = box;
  if ((box != (int *)0x0) ||
     (__ptr = (int *)calloc(((m - (uVar9 + uVar12)) + 1) * n,4), __ptr != (int *)0x0)) {
    __dest_00 = calloc(l * 2,8);
    if (__dest_00 != (void *)0x0) {
      if (r == (size_t *)0x0) {
        if (l != 0) {
          sVar5 = 0;
          do {
            *(undefined8 *)((long)__dest_00 + sVar5 * 8) = 1;
            sVar5 = sVar5 + 1;
          } while (l != sVar5);
        }
      }
      else {
        memcpy(__dest_00,r,l * 8);
      }
      __dest = (void *)((long)__dest_00 + l * 8);
      if (s != (size_t *)0x0) {
        memcpy(__dest,s,l * 8);
      }
      lVar7 = ((m - uVar9) - uVar12) + 1;
      if (lVar7 * n != 0) {
        memset(__ptr,0,lVar7 * n * 4);
      }
      if (l != 0) {
        local_70 = series + uVar9;
        sVar5 = 0;
        do {
          if (n != 0) {
            lVar2 = *(long *)((long)__dest_00 + sVar5 * 8);
            lVar3 = *(long *)((long)__dest + sVar5 * 8);
            piVar8 = local_70 + -lVar2;
            piVar10 = local_70 + lVar3;
            sVar13 = 0;
            piVar6 = __ptr + 1;
            do {
              if (uVar9 - lVar2 < lVar3 + uVar9) {
                iVar14 = 1;
                lVar11 = 0;
                iVar15 = 0;
                do {
                  iVar14 = iVar14 * b[sVar5];
                  iVar15 = iVar15 * b[sVar5] + piVar8[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar2 + lVar3 != lVar11);
              }
              else {
                iVar14 = 1;
                iVar15 = 0;
              }
              __ptr[sVar13 * lVar7] = __ptr[sVar13 * lVar7] * iVar14 + iVar15;
              if (uVar9 < m - uVar12) {
                lVar11 = 0;
                do {
                  iVar15 = (iVar15 * b[sVar5] - piVar8[lVar11] * iVar14) + piVar10[lVar11];
                  piVar6[lVar11] = piVar6[lVar11] * iVar14 + iVar15;
                  lVar1 = uVar9 + lVar11;
                  lVar11 = lVar11 + 1;
                } while (lVar1 + 1U < m - uVar12);
              }
              sVar13 = sVar13 + 1;
              piVar8 = piVar8 + m;
              piVar6 = piVar6 + lVar7;
              piVar10 = piVar10 + m;
            } while (sVar13 != n);
          }
          sVar5 = sVar5 + 1;
          local_70 = local_70 + m * n;
        } while (sVar5 != l);
      }
      _Var4 = inform_failed(err);
      piVar10 = (int *)0x0;
      if (!_Var4) {
        piVar10 = __ptr;
      }
      if (_Var4 && box == (int *)0x0) {
        free(__ptr);
        piVar10 = (int *)0x0;
      }
      free(__dest_00);
      return piVar10;
    }
    if (box == (int *)0x0) {
      free(__ptr);
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (int *)0x0;
}

Assistant:

int* inform_black_box(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, int *box, inform_error *err)
{
    if (check_arguments(series, l, n, m, b, r, s, err))
    {
        return NULL;
    }
    size_t max_r, max_s;
    compute_lengths(r, s, l, &max_r, &max_s);

    bool allocate = (box == NULL);
    if (allocate)
    {
        box = calloc(n * (m - max_r - max_s + 1), sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t *data = calloc(2 * l, sizeof(size_t));
    if (data == NULL)
    {
        if (allocate) free(box);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    size_t *history = data;
    if (r == NULL)
    {
        for (size_t i = 0; i < l; ++i) history[i] = 1;
    }
    else
    {
        memcpy(history, r, l * sizeof(size_t));
    }

    size_t *future = data + l;
    if (s != NULL)
    {
        memcpy(future, s, l * sizeof(size_t));
    }

    accumulate(series, l, n, m, b, history, future, max_r, max_s, box, err);

    if (inform_failed(err))
    {
        if (allocate) free(box);
        box = NULL;
    }
    free(data);
    return box;
}